

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O1

void __thiscall xray_re::cse_alife_trader::state_write(cse_alife_trader *this)

{
  xr_packet *in_RSI;
  
  state_write((cse_alife_trader *)
              &this[-1].super_cse_alife_dynamic_object_visual.super_cse_alife_dynamic_object.
               super_cse_alife_object.super_cse_abstract.m_ini_string.field_2,in_RSI);
  return;
}

Assistant:

void cse_alife_trader::state_write(xr_packet& packet)
{
	cse_alife_dynamic_object_visual::state_write(packet);
	cse_alife_trader_abstract::state_write(packet);
	if (m_version < CSE_VERSION_0x76) {
		packet.w_u32(UNDEF32);	// m_tOrdID
		packet.w_u32(0);	// m_tpOrderedArtefacts
		packet.w_u32(0);	// m_tSupplies
	}
}